

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::setupShaderData(ShaderOperatorCase *this)

{
  DataType DVar1;
  ostringstream *this_00;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  ShaderValue *pSVar7;
  char *__s;
  ostringstream *poVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar9;
  string *psVar10;
  int rowNdx;
  ShaderOperatorCase *pSVar11;
  int row;
  int precision;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  Precision PVar16;
  undefined1 *puVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  undefined4 uVar23;
  float fVar24;
  string prefix;
  char *inputPrecision [3];
  Mat4 attribMatrix;
  ostringstream vtx;
  ostringstream frag;
  undefined1 auStack_558 [8];
  ostringstream *local_550;
  ShaderOperatorCase *local_548;
  ShaderType local_53c;
  ShaderValue *local_538;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *local_530;
  undefined1 local_528 [4];
  float fStack_524;
  undefined4 uStack_520;
  float fStack_51c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  char *local_508;
  string local_500;
  long *local_4e0;
  long local_4d8;
  long local_4d0 [2];
  ShaderValue *local_4c0;
  undefined8 auStack_4b8 [4];
  string local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  local_53c = (ShaderType)(this->super_ShaderRenderCase).m_isVertexCase;
  PVar16 = (this->m_spec).precision;
  if (PVar16 == PRECISION_LAST) {
    local_508 = (char *)0x0;
  }
  else {
    local_508 = glu::getPrecisionName(PVar16);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_550 = (ostringstream *)local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    local_550 = (ostringstream *)local_320;
  }
  local_548 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 300 es\n",0x10);
  pSVar11 = local_548;
  if (0 < (local_548->m_spec).numInputs) {
    pSVar7 = (local_548->m_spec).inputs;
    lVar18 = 0;
    do {
      PVar16 = PRECISION_HIGHP;
      if (7 < pSVar7->type - TYPE_INT) {
        PVar16 = (pSVar11->m_spec).precision;
      }
      if (pSVar7->type - TYPE_BOOL < 4) {
        PVar16 = PRECISION_MEDIUMP;
      }
      pcVar4 = glu::getPrecisionName(PVar16);
      auStack_4b8[lVar18] = pcVar4;
      lVar18 = lVar18 + 1;
      pSVar7 = pSVar7 + 1;
    } while (lVar18 < (pSVar11->m_spec).numInputs);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  if (0 < (local_548->m_spec).numInputs) {
    lVar18 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
      pcVar4 = (char *)auStack_4b8[lVar18];
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)auStack_558 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x238);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar4,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 a_in",10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_320,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
      lVar18 = lVar18 + 1;
    } while (lVar18 < (local_548->m_spec).numInputs);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if ((local_548->super_ShaderRenderCase).m_isVertexCase == false) {
    if (0 < (local_548->m_spec).numInputs) {
      lVar18 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
        pcVar4 = (char *)auStack_4b8[lVar18];
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)auStack_558 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0x238);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," vec4 v_in",10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_320,(int)lVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)auStack_558 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x3b0);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," vec4 v_in",10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)lVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (local_548->m_spec).numInputs);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"out mediump vec4 v_color;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in mediump vec4 v_color;\n",0x19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  pSVar11 = local_548;
  pcVar4 = "v_";
  bVar20 = (local_548->super_ShaderRenderCase).m_isVertexCase != false;
  if (bVar20) {
    pcVar4 = "a_";
  }
  local_4e0 = local_4d0;
  pcVar13 = "";
  if (bVar20) {
    pcVar13 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,pcVar4,pcVar13);
  if (0 < (pSVar11->m_spec).numInputs) {
    pSVar7 = (local_548->m_spec).inputs;
    puVar17 = s_inSwizzles;
    lVar18 = 0;
    do {
      DVar1 = pSVar7->type;
      local_4c0 = pSVar7;
      uVar2 = glu::getDataTypeScalarSize(DVar1);
      __s = glu::getDataTypeName(DVar1);
      pcVar4 = *(char **)(puVar17 + (long)(int)(uVar2 - 1) * 8);
      local_538 = (ShaderValue *)(ulong)uVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"\t",1);
      pcVar13 = local_508;
      local_530 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
                  CONCAT44(local_530._4_4_,DVar1 - TYPE_BOOL);
      if (local_508 != (char *)0x0 && 3 < DVar1 - TYPE_BOOL) {
        sVar5 = strlen(local_508);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,pcVar13,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550," ",1);
      }
      if (__s == (char *)0x0) {
        std::ios::clear((int)local_550 + (int)*(undefined8 *)(*(long *)local_550 + -0x18));
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550," in",3);
      poVar6 = (ostream *)std::ostream::operator<<(local_550,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      if ((uint)local_530._0_4_ < 4) {
        pcVar13 = "greaterThan(";
        if (local_538._0_4_ == 1.4013e-45) {
          pcVar13 = "(";
        }
        lVar19 = 0xc;
        if (local_538._0_4_ == 1.4013e-45) {
          lVar19 = 1;
        }
LAB_010cedf8:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,pcVar13,lVar19);
      }
      else if (DVar1 - TYPE_INT < 8) {
        if (__s == (char *)0x0) {
          lVar19 = 1;
          std::ios::clear((int)local_550 + (int)*(undefined8 *)(*(long *)local_550 + -0x18));
          pcVar13 = "(";
        }
        else {
          sVar5 = strlen(__s);
          lVar19 = 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,__s,sVar5);
          pcVar13 = "(";
        }
        goto LAB_010cedf8;
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_550,(char *)local_4e0,local_4d8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"in",2);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar5);
      }
      poVar8 = local_550;
      if ((uint)local_530._0_4_ < 4) {
        lVar19 = 7;
        pcVar4 = " > 0.0)";
        if (local_538._0_4_ != 1.4013e-45) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,", vec",5);
          poVar8 = (ostringstream *)std::ostream::operator<<(local_550,(int)local_538);
          lVar19 = 6;
          pcVar4 = "(0.0))";
        }
LAB_010ceef9:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,pcVar4,lVar19);
      }
      else {
        lVar19 = 1;
        pcVar4 = ")";
        if (DVar1 - TYPE_INT < 8) goto LAB_010ceef9;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,";\n",2);
      lVar18 = lVar18 + 1;
      pSVar7 = local_4c0 + 1;
      puVar17 = puVar17 + 0x20;
    } while (lVar18 < (local_548->m_spec).numInputs);
  }
  pSVar11 = local_548;
  pcVar13 = glu::getDataTypeName((local_548->m_spec).output);
  DVar1 = (pSVar11->m_spec).output;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"\t",1);
  pcVar4 = local_508;
  if ((local_508 != (char *)0x0) && (3 < DVar1 - TYPE_BOOL)) {
    sVar5 = strlen(local_508);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,pcVar4,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550," ",1);
  }
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)local_550 + (int)*(undefined8 *)(*(long *)local_550 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,pcVar13,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550," res = ",7);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)local_550 + (int)*(undefined8 *)(*(long *)local_550 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,pcVar13,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"(0.0);\n\n",8);
  poVar8 = local_550;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"\t",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar8,(pSVar11->m_shaderOp)._M_dataplus._M_p,
                      (pSVar11->m_shaderOp)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
  DVar1 = (pSVar11->m_spec).output;
  iVar3 = glu::getDataTypeScalarSize(DVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar8,"\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,"\tcolor.",7);
  lVar18 = (long)(iVar3 + -1);
  pcVar4 = *(char **)(s_outSwizzles + lVar18 * 8);
  sVar5 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,pcVar4,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8," = ",3);
  this_00 = local_550;
  bVar20 = 3 < DVar1 - TYPE_FLOAT;
  bVar21 = iVar3 != 1;
  pcVar4 = "float(res)";
  if (bVar21 || !bVar20) {
    pcVar4 = "res";
  }
  lVar19 = 10;
  if (bVar21 || !bVar20) {
    lVar19 = 3;
  }
  if (bVar21 && bVar20) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,"vec",3);
    poVar8 = (ostringstream *)std::ostream::operator<<(this_00,iVar3);
    lVar19 = 5;
    pcVar4 = "(res)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,pcVar4,lVar19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_550,";\n",2);
  iVar3 = (*((pSVar11->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  local_53c = local_53c ^ SHADERTYPE_FRAGMENT;
  fVar22 = FloatScalar::getValue
                     (&(pSVar11->m_spec).resultScale,(Functions *)CONCAT44(extraout_var,iVar3),
                      local_53c);
  local_530 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
              CONCAT44(local_530._4_4_,fVar22);
  iVar3 = (*((pSVar11->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  poVar8 = local_550;
  fVar22 = FloatScalar::getValue
                     (&(pSVar11->m_spec).resultBias,(Functions *)CONCAT44(extraout_var_00,iVar3),
                      local_53c);
  local_538 = (ShaderValue *)CONCAT44(local_538._4_4_,fVar22);
  if ((((local_530._0_4_ != 1.0) || (NAN(local_530._0_4_))) || (fVar22 != 0.0)) || (NAN(fVar22))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,"\tcolor = color",0xe);
    if ((local_530._0_4_ != 1.0) || (NAN(local_530._0_4_))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8," * ",3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
      std::ostream::_M_insert<double>((double)local_530._0_4_);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
      std::ios_base::~ios_base(local_428);
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"1.0","");
      twoValuedVec4((string *)local_528,&local_500,&local_498,
                    (BVec4 *)(s_outSwizzleChannelMasks + lVar18 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8,(char *)CONCAT44(fStack_524,local_528),
                 CONCAT44(fStack_51c,uStack_520));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_524,local_528) != &local_518) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_524,local_528),local_518._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_538._0_4_ != 0.0) || (NAN(local_538._0_4_))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8," + ",3);
      de::floatToString_abi_cxx11_((string *)local_528,(de *)0x2,local_538._0_4_,precision);
      local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"0.0","");
      twoValuedVec4(&local_498,(string *)local_528,&local_500,
                    (BVec4 *)(s_outSwizzleChannelMasks + lVar18 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar8,local_498._M_dataplus._M_p,local_498._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_524,local_528) != &local_518) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_524,local_528),local_518._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,";\n",2);
  }
  if ((pSVar11->super_ShaderRenderCase).m_isVertexCase == false) {
    lVar18 = 0x12;
    pcVar4 = "\to_color = color;\n";
    if (0 < (pSVar11->m_spec).numInputs) {
      iVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_in",5);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = a_in",7);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
        iVar3 = iVar3 + 1;
      } while (iVar3 < (local_548->m_spec).numInputs);
      lVar18 = 0x12;
      pcVar4 = "\to_color = color;\n";
      pSVar11 = local_548;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_color = color;\n",0x12);
    lVar18 = 0x14;
    pcVar4 = "\to_color = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar11->super_ShaderRenderCase).m_vertShaderSource,(string *)&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar11->super_ShaderRenderCase).m_fragShaderSource,(string *)&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  local_530 = &(pSVar11->super_ShaderRenderCase).m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (local_530,(long)(pSVar11->m_spec).numInputs);
  if (0 < (pSVar11->m_spec).numInputs) {
    local_538 = (pSVar11->m_spec).inputs;
    lVar18 = 0;
    lVar19 = 0;
    do {
      iVar3 = (*((pSVar11->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
      pSVar7 = local_538;
      fVar22 = FloatScalar::getValue
                         (&local_538[lVar19].rangeMin,(Functions *)CONCAT44(extraout_var_01,iVar3),
                          local_53c);
      local_550 = (ostringstream *)CONCAT44(local_550._4_4_,fVar22);
      iVar3 = (*((local_548->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
      fVar22 = FloatScalar::getValue
                         (&pSVar7[lVar19].rangeMax,(Functions *)CONCAT44(extraout_var_02,iVar3),
                          local_53c);
      local_468 = 0;
      uStack_460 = 0;
      local_478 = 0;
      uStack_470 = 0;
      local_498.field_2._M_allocated_capacity = 0;
      local_498.field_2._8_8_ = 0;
      local_498._M_dataplus._M_p = (pointer)0x0;
      local_498._M_string_length = 0;
      lVar9 = 0;
      lVar14 = 0;
      psVar10 = &local_498;
      do {
        lVar15 = 0;
        do {
          uVar23 = 0x3f800000;
          if (lVar9 != lVar15) {
            uVar23 = 0;
          }
          *(undefined4 *)((long)&(psVar10->_M_dataplus)._M_p + lVar15) = uVar23;
          lVar15 = lVar15 + 0x10;
        } while (lVar15 != 0x40);
        lVar14 = lVar14 + 1;
        psVar10 = (string *)((long)&(psVar10->_M_dataplus)._M_p + 4);
        lVar9 = lVar9 + 0x10;
      } while (lVar14 != 4);
      fVar24 = fVar22 - local_550._0_4_;
      lVar9 = 0;
      psVar10 = &local_498;
      do {
        uVar12 = (int)lVar9 + (int)lVar19;
        uVar2 = (int)lVar9 + 3 + (int)lVar19;
        if (-1 < (int)uVar12) {
          uVar2 = uVar12;
        }
        local_528 = (undefined1  [4])0x0;
        fStack_524 = 0.0;
        uStack_520 = 0;
        fStack_51c = 0.0;
        switch(uVar12 - (uVar2 & 0xfffffffc)) {
        case 0:
          local_528 = (undefined1  [4])fVar24;
          fStack_524 = 0.0;
          uStack_520 = 0;
          break;
        case 1:
          local_528 = (undefined1  [4])0x0;
          fStack_524 = fVar24;
          uStack_520 = 0;
          break;
        case 2:
          local_528 = (undefined1  [4])-fVar24;
          fStack_524 = 0.0;
          uStack_520 = 0;
          goto LAB_010cf769;
        case 3:
          local_528 = (undefined1  [4])0x0;
          fStack_524 = -fVar24;
          uStack_520 = 0;
LAB_010cf769:
          fStack_51c = fVar22;
        default:
          goto switchD_010cf735_default;
        }
        fStack_51c = local_550._0_4_;
switchD_010cf735_default:
        uStack_520 = 0;
        lVar14 = 0;
        do {
          *(undefined4 *)((long)&(psVar10->_M_dataplus)._M_p + lVar14 * 4) =
               *(undefined4 *)(local_528 + lVar14);
          lVar14 = lVar14 + 4;
        } while (lVar14 != 0x10);
        lVar9 = lVar9 + 1;
        psVar10 = (string *)((long)&(psVar10->_M_dataplus)._M_p + 4);
      } while (lVar9 != 4);
      lVar9 = (long)(((local_530->
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data + lVar18
      ;
      lVar14 = 0;
      psVar10 = &local_498;
      do {
        lVar15 = 0;
        do {
          *(undefined4 *)(lVar9 + lVar15) =
               *(undefined4 *)((long)&(psVar10->_M_dataplus)._M_p + lVar15);
          lVar15 = lVar15 + 0x10;
        } while (lVar15 != 0x40);
        lVar14 = lVar14 + 1;
        lVar9 = lVar9 + 4;
        psVar10 = (string *)((long)&(psVar10->_M_dataplus)._M_p + 4);
      } while (lVar14 != 4);
      lVar19 = lVar19 + 1;
      lVar18 = lVar18 + 0x40;
      pSVar11 = local_548;
    } while (lVar19 < (local_548->m_spec).numInputs);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0,local_4d0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return;
}

Assistant:

void ShaderOperatorCase::setupShaderData (void)
{
	ShaderType		shaderType	= m_isVertexCase ? SHADERTYPE_VERTEX : SHADERTYPE_FRAGMENT;
	const char*		precision	= m_spec.precision != PRECISION_LAST ? getPrecisionName(m_spec.precision) : DE_NULL;
	const char*		inputPrecision[MAX_INPUTS];

	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= m_isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n";

	// Compute precision for inputs.
	for (int i = 0; i < m_spec.numInputs; i++)
	{
		bool		isBoolVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_BOOL, TYPE_BOOL_VEC4);
		bool		isIntVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_INT, TYPE_INT_VEC4);
		bool		isUintVal	= de::inRange<int>(m_spec.inputs[i].type, TYPE_UINT, TYPE_UINT_VEC4);
		// \note Mediump interpolators are used for booleans, and highp for integers.
		Precision	prec		= isBoolVal	? PRECISION_MEDIUMP
								: isIntVal || isUintVal ? PRECISION_HIGHP
								: m_spec.precision;
		inputPrecision[i] = getPrecisionName(prec);
	}

	// Attributes.
	vtx << "in highp vec4 a_position;\n";
	for (int i = 0; i < m_spec.numInputs; i++)
		vtx << "in " << inputPrecision[i] << " vec4 a_in" << i << ";\n";

	// Color output.
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	if (m_isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < m_spec.numInputs; i++)
		{
			vtx << "out " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
			frag << "in " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Expression inputs.
	string prefix = m_isVertexCase ? "a_" : "v_";
	for (int i = 0; i < m_spec.numInputs; i++)
	{
		DataType		inType		= m_spec.inputs[i].type;
		int				inSize		= getDataTypeScalarSize(inType);
		bool			isInt		= de::inRange<int>(inType, TYPE_INT, TYPE_INT_VEC4);
		bool			isUint		= de::inRange<int>(inType, TYPE_UINT, TYPE_UINT_VEC4);
		bool			isBool		= de::inRange<int>(inType, TYPE_BOOL, TYPE_BOOL_VEC4);
		const char*		typeName	= getDataTypeName(inType);
		const char*		swizzle		= s_inSwizzles[i][inSize-1];

		op << "\t";
		if (precision && !isBool) op << precision << " ";

		op << typeName << " in" << i << " = ";

		if (isBool)
		{
			if (inSize == 1)	op << "(";
			else				op << "greaterThan(";
		}
		else if (isInt || isUint)
			op << typeName << "(";

		op << prefix << "in" << i << "." << swizzle;

		if (isBool)
		{
			if (inSize == 1)	op << " > 0.0)";
			else				op << ", vec" << inSize << "(0.0))";
		}
		else if (isInt || isUint)
			op << ")";

		op << ";\n";
	}

	// Result variable.
	{
		const char* outTypeName = getDataTypeName(m_spec.output);
		bool		isBoolOut	= de::inRange<int>(m_spec.output, TYPE_BOOL, TYPE_BOOL_VEC4);

		op << "\t";
		if (precision && !isBoolOut) op << precision << " ";
		op << outTypeName << " res = " << outTypeName << "(0.0);\n\n";
	}

	// Expression.
	op << "\t" << m_shaderOp << "\n\n";

	// Convert to color.
	bool	isResFloatVec	= de::inRange<int>(m_spec.output, TYPE_FLOAT, TYPE_FLOAT_VEC4);
	int		outScalarSize	= getDataTypeScalarSize(m_spec.output);

	op << "\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n";
	op << "\tcolor." << s_outSwizzles[outScalarSize-1] << " = ";

	if (!isResFloatVec && outScalarSize == 1)
		op << "float(res)";
	else if (!isResFloatVec)
		op << "vec" << outScalarSize << "(res)";
	else
		op << "res";

	op << ";\n";

	// Scale & bias.
	float	resultScale		= m_spec.resultScale.getValue(m_renderCtx.getFunctions(), shaderType);
	float	resultBias		= m_spec.resultBias.getValue(m_renderCtx.getFunctions(), shaderType);
	if ((resultScale != 1.0f) || (resultBias != 0.0f))
	{
		op << "\tcolor = color";
		if (resultScale != 1.0f) op << " * " << twoValuedVec4(de::toString(resultScale),		"1.0", s_outSwizzleChannelMasks[outScalarSize-1]);
		if (resultBias != 0.0f)  op << " + " << twoValuedVec4(de::floatToString(resultBias, 2),	"0.0", s_outSwizzleChannelMasks[outScalarSize-1]);
		op << ";\n";
	}

	// ..
	if (m_isVertexCase)
	{
		vtx << "	v_color = color;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		for (int i = 0; i < m_spec.numInputs; i++)
		vtx << "	v_in" << i << " = a_in" << i << ";\n";
		frag << "	o_color = color;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	// Setup the user attributes.
	m_userAttribTransforms.resize(m_spec.numInputs);
	for (int inputNdx = 0; inputNdx < m_spec.numInputs; inputNdx++)
	{
		const ShaderValue& v = m_spec.inputs[inputNdx];
		DE_ASSERT(v.type != TYPE_LAST);

		float rangeMin	= v.rangeMin.getValue(m_renderCtx.getFunctions(), shaderType);
		float rangeMax	= v.rangeMax.getValue(m_renderCtx.getFunctions(), shaderType);
		float scale		= rangeMax - rangeMin;
		float minBias	= rangeMin;
		float maxBias	= rangeMax;
		Mat4  attribMatrix;

		for (int rowNdx = 0; rowNdx < 4; rowNdx++)
		{
			Vec4 row;

			switch ((rowNdx + inputNdx) % 4)
			{
				case 0:	row = Vec4(scale, 0.0f, 0.0f, minBias);		break;
				case 1:	row = Vec4(0.0f, scale, 0.0f, minBias);		break;
				case 2:	row = Vec4(-scale, 0.0f, 0.0f, maxBias);	break;
				case 3:	row = Vec4(0.0f, -scale, 0.0f, maxBias);	break;
				default: DE_ASSERT(false);
			}

			attribMatrix.setRow(rowNdx, row);
		}

		m_userAttribTransforms[inputNdx] = attribMatrix;
	}
}